

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O3

Function * __thiscall
TCV::getRightFunction
          (TCV *this,vector<Function_*,_std::allocator<Function_*>_> *__functions,ASTNode *_node)

{
  pointer ppVVar1;
  pointer pcVar2;
  ulong uVar3;
  bool bVar4;
  ASTNode *_node_00;
  vector<Variable_*,_std::allocator<Variable_*>_> *pvVar5;
  ulong uVar6;
  string *psVar7;
  long lVar8;
  pointer ppFVar9;
  Function *pFVar10;
  pointer ppFVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  callParams;
  string fType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  pointer local_58;
  string local_50;
  
  _node_00 = AST::ASTNode::getChild(_node,1);
  getParamsType_abi_cxx11_(&local_70,this,_node_00);
  ppFVar11 = (__functions->super__Vector_base<Function_*,_std::allocator<Function_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppFVar9 = (__functions->super__Vector_base<Function_*,_std::allocator<Function_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppFVar11 != ppFVar9) {
    local_58 = ppFVar9;
    do {
      pvVar5 = Function::getParams(*ppFVar11);
      if ((long)(pvVar5->super__Vector_base<Variable_*,_std::allocator<Variable_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar5->super__Vector_base<Variable_*,_std::allocator<Variable_*>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 ==
          (long)local_70.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_70.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5) {
        lVar8 = 0;
        uVar3 = 0;
        do {
          uVar6 = uVar3;
          pvVar5 = Function::getParams(*ppFVar11);
          if ((ulong)((long)(pvVar5->super__Vector_base<Variable_*,_std::allocator<Variable_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar5->super__Vector_base<Variable_*,_std::allocator<Variable_*>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar6) break;
          pvVar5 = Function::getParams(*ppFVar11);
          ppVVar1 = (pvVar5->super__Vector_base<Variable_*,_std::allocator<Variable_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          if ((ulong)((long)(pvVar5->super__Vector_base<Variable_*,_std::allocator<Variable_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3) <= uVar6
             ) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar6);
          }
          psVar7 = Variable::getType_abi_cxx11_(ppVVar1[uVar6]);
          pcVar2 = (psVar7->_M_dataplus)._M_p;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar2,pcVar2 + psVar7->_M_string_length);
          if ((ulong)((long)local_70.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_70.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar6) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar6);
          }
          bVar4 = isMatchType(&local_50,
                              (string *)
                              ((long)&((local_70.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          lVar8 = lVar8 + 0x20;
          uVar3 = uVar6 + 1;
        } while (bVar4);
        ppFVar9 = local_58;
        if ((long)local_70.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_70.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5 == (uVar6 & 0xffffffff)) {
          pFVar10 = *ppFVar11;
          goto LAB_00130874;
        }
      }
      ppFVar11 = ppFVar11 + 1;
    } while (ppFVar11 != ppFVar9);
  }
  pFVar10 = (Function *)0x0;
LAB_00130874:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  return pFVar10;
}

Assistant:

Function *TCV::getRightFunction(const std::vector<Function *> &__functions, AST::ASTNode *_node) {
    auto callParams = getParamsType(_node->getChild(1));
    for (const auto &_function : __functions) {
        if (_function->getParams().size() != callParams.size()) continue;
        int matchedParams = 0;
        for (int i = 0; i < _function->getParams().size(); i++) {
            auto fType = _function->getParams().at(i)->getType();
            if (!isMatchType(fType, callParams.at(i))) break;
            else matchedParams++;
        }
        if (matchedParams == callParams.size()) return _function;
    }
    return nullptr;
}